

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogSyslog.cpp
# Opt level: O0

void __thiscall liblogger::LogSyslog::Log(LogSyslog *this,LogType Type,string *str)

{
  undefined8 uVar1;
  undefined4 in_ESI;
  
  switch(in_ESI) {
  case 0:
    uVar1 = std::__cxx11::string::c_str();
    syslog(7,"%s",uVar1);
    break;
  case 1:
    uVar1 = std::__cxx11::string::c_str();
    syslog(6,"%s",uVar1);
    break;
  case 2:
    uVar1 = std::__cxx11::string::c_str();
    syslog(5,"%s",uVar1);
    break;
  case 3:
    uVar1 = std::__cxx11::string::c_str();
    syslog(4,"%s",uVar1);
    break;
  case 4:
    uVar1 = std::__cxx11::string::c_str();
    syslog(3,"%s",uVar1);
    break;
  case 5:
    uVar1 = std::__cxx11::string::c_str();
    syslog(2,"%s",uVar1);
    break;
  case 6:
    uVar1 = std::__cxx11::string::c_str();
    syslog(1,"%s",uVar1);
    break;
  case 7:
    uVar1 = std::__cxx11::string::c_str();
    syslog(0,"%s",uVar1);
    break;
  default:
    abort();
  }
  return;
}

Assistant:

void LogSyslog::Log(const LogType Type, const std::string &str) {
	switch(Type)
	{
		case LOGGER_DEBUG:
			syslog(LOG_DEBUG, "%s", str.c_str());
			break;
		case LOGGER_INFO:
			syslog(LOG_INFO, "%s", str.c_str());
			break;
		case LOGGER_NOTICE:
			syslog(LOG_NOTICE, "%s", str.c_str());
			break;
		case LOGGER_WARNING:
			syslog(LOG_WARNING, "%s", str.c_str());
			break;
		case LOGGER_ERR:
			syslog(LOG_ERR, "%s", str.c_str());
			break;
		case LOGGER_CRIT:
			syslog(LOG_CRIT, "%s", str.c_str());
			break;
		case LOGGER_ALERT:
			syslog(LOG_ALERT, "%s", str.c_str());
			break;
		case LOGGER_EMERG:
			syslog(LOG_EMERG, "%s", str.c_str());
			break;
		default:
			abort();
			break;
	}
}